

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationDriveline::IntFromDescriptor
          (ChLinkMotorRotationDriveline *this,uint off_v,ChStateDelta *v,uint off_L,
          ChVectorDynamic<> *L)

{
  int iVar1;
  long *plVar2;
  element_type *peVar3;
  element_type *peVar4;
  
  ChLinkMateGeneric::IntFromDescriptor((ChLinkMateGeneric *)this,off_v,v,off_L,L);
  plVar2 = *(long **)&(this->super_ChLinkMotorRotation).field_0x278;
  (**(code **)(*plVar2 + 0x148))(plVar2,off_v,v,off_L,L);
  peVar3 = (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x29])
            (peVar3,(ulong)(off_v + 1),v,(ulong)off_L,L);
  peVar4 = (this->innerconstraint1).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x29])
            (peVar4,(ulong)off_v,v,(ulong)(iVar1 + off_L),L);
  peVar4 = (this->innerconstraint2).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x29])
            (peVar4,(ulong)off_v,v,(ulong)(iVar1 + 1 + off_L),L);
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::IntFromDescriptor(const unsigned int off_v,
                                     ChStateDelta& v,
                                     const unsigned int off_L,
                                     ChVectorDynamic<>& L) {
    // First, inherit to parent class
    ChLinkMotorRotation::IntFromDescriptor(off_v, v, off_L, L);

    innershaft1->IntFromDescriptor(off_v, v, off_L, L);
    innershaft2->IntFromDescriptor(off_v + 1, v, off_L, L);
    int nc = mask.nconstr;
    innerconstraint1->IntFromDescriptor(off_v, v, off_L + nc + 0, L);
    innerconstraint2->IntFromDescriptor(off_v, v, off_L + nc + 1, L);
}